

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O1

void Luv24toRGB(LogLuvState *sp,uint8_t *op,tmsize_t n)

{
  uint32_t p;
  long lVar1;
  uint32_t *puVar2;
  float xyz [3];
  float local_2c [3];
  
  if (0 < n) {
    puVar2 = (uint32_t *)sp->tbuf;
    lVar1 = n + 1;
    do {
      p = *puVar2;
      puVar2 = puVar2 + 1;
      LogLuv24toXYZ(p,local_2c);
      XYZtoRGB24(local_2c,op);
      op = op + 3;
      lVar1 = lVar1 + -1;
    } while (1 < lVar1);
  }
  return;
}

Assistant:

static void Luv24toRGB(LogLuvState *sp, uint8_t *op, tmsize_t n)
{
    uint32_t *luv = (uint32_t *)sp->tbuf;
    uint8_t *rgb = (uint8_t *)op;

    while (n-- > 0)
    {
        float xyz[3];

        LogLuv24toXYZ(*luv++, xyz);
        XYZtoRGB24(xyz, rgb);
        rgb += 3;
    }
}